

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O1

void composition_destination_atop(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (const_alpha == 0xff) {
    if (0 < length) {
      uVar1 = 0;
      do {
        uVar3 = src[uVar1];
        uVar5 = dest[uVar1];
        uVar4 = (uVar3 & 0xff00ff) * (~uVar5 >> 0x18) + (uVar5 & 0xff00ff) * (uVar3 >> 0x18);
        uVar3 = (uVar3 >> 8 & 0xff00ff) * (~uVar5 >> 0x18) +
                (uVar5 >> 8 & 0xff00ff) * (uVar3 >> 0x18);
        dest[uVar1] = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00 |
                      uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  else if (0 < length) {
    uVar1 = 0;
    do {
      uVar4 = (src[uVar1] & 0xff00ff) * const_alpha;
      uVar3 = (src[uVar1] >> 8 & 0xff00ff) * const_alpha;
      uVar5 = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff);
      uVar3 = dest[uVar1];
      iVar2 = ((uVar5 >> 0x18) - const_alpha) + 0xff;
      uVar4 = (uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff) * (~uVar3 >> 0x18) +
              (uVar3 & 0xff00ff) * iVar2;
      uVar3 = (uVar5 >> 8 & 0xff00ff) * (~uVar3 >> 0x18) + (uVar3 >> 8 & 0xff00ff) * iVar2;
      dest[uVar1] = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00 |
                    uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  return;
}

Assistant:

static void composition_destination_atop(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t s = src[i];
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(d, plutovg_alpha(s), s, plutovg_alpha(~d));
        }
    } else {
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            uint32_t d = dest[i];
            uint32_t a = plutovg_alpha(s) + cia;
            dest[i] = INTERPOLATE_PIXEL(d, a, s, plutovg_alpha(~d));
        }
    }
}